

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O0

bool __thiscall AmpIO::WriteDigitalOutput(AmpIO *this,uint8_t mask,uint8_t bits)

{
  BasePort *pBVar1;
  uint32_t uVar2;
  int iVar3;
  byte local_12;
  byte local_11;
  quadlet_t write_data;
  uint8_t bits_local;
  uint8_t mask_local;
  AmpIO *this_local;
  
  uVar2 = BoardIO::GetFirmwareVersion((BoardIO *)this);
  local_12 = bits;
  local_11 = mask;
  if (uVar2 < 5) {
    local_11 = BitReverse4[(int)(mask & 0xf)];
    local_12 = BitReverse4[(int)(bits & 0xf)];
  }
  pBVar1 = (this->super_FpgaIO).super_BoardIO.port;
  iVar3 = (*pBVar1->_vptr_BasePort[0x24])
                    (pBVar1,(ulong)(this->super_FpgaIO).super_BoardIO.BoardId,6,
                     (ulong)((uint)local_11 << 8 | (local_12 ^ 0xffffffff) & (uint)local_11));
  return (bool)((byte)iVar3 & 1);
}

Assistant:

bool AmpIO::WriteDigitalOutput(uint8_t mask, uint8_t bits)
{
    // Firmware versions < 5 have bits in reverse order with respect to schematic
    // (do not need to handle more than 4 bits in this case)
    if (GetFirmwareVersion() < 5) {
        mask = BitReverse4[mask&0x0f];
        bits = BitReverse4[bits&0x0f];
    }
    // Starting with Version 1.3.0 of this library, the digital outputs are inverted
    // before being sent because they are inverted in hardware and/or firmware.
    // This way, the digital output state matches the hardware state (i.e., 0 means digital output
    // is at 0V).
    quadlet_t write_data = (static_cast<quadlet_t>(mask) << 8) | (static_cast<quadlet_t>(~bits)&mask);
    return port->WriteQuadlet(BoardId, 6, write_data);
}